

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

Statement *
slang::ast::Statement::bindItems
          (SyntaxList<slang::syntax::SyntaxNode> *items,ASTContext *context,
          StatementContext *stmtCtx)

{
  size_t sVar1;
  pointer ppSVar2;
  SyntaxKind *pSVar3;
  Compilation *this;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  StatementList *pSVar6;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *src;
  long lVar7;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> local_98;
  SmallVectorBase<const_slang::ast::Statement_*> local_88 [2];
  SourceRange local_48;
  
  local_88[0].data_ = (pointer)local_88[0].firstElement;
  local_88[0].len = 0;
  local_88[0].cap = 5;
  bindScopeInitializers(context,local_88);
  sVar1 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  src = extraout_RDX;
  if (sVar1 != 0) {
    ppSVar2 = (items->super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>)._M_ptr;
    lVar7 = 0;
    do {
      pSVar3 = *(SyntaxKind **)((long)ppSVar2 + lVar7);
      bVar4 = slang::syntax::StatementSyntax::isKind(*pSVar3);
      src = extraout_RDX_00;
      if (bVar4) {
        iVar5 = bind((int)pSVar3,(sockaddr *)context,(socklen_t)stmtCtx);
        local_98._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
        SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                  ((SmallVectorBase<slang::ast::Statement_const*> *)local_88,(Statement **)&local_98
                  );
        src = extraout_RDX_01;
      }
      lVar7 = lVar7 + 8;
    } while (sVar1 << 3 != lVar7);
  }
  if (local_88[0].len == 1) {
    pSVar6 = (StatementList *)*local_88[0].data_;
  }
  else {
    this = ((context->scope).ptr)->compilation;
    iVar5 = SmallVectorBase<const_slang::ast::Statement_*>::copy(local_88,(EVP_PKEY_CTX *)this,src);
    local_98._M_ptr = (pointer)CONCAT44(extraout_var_00,iVar5);
    local_48.startLoc = (SourceLocation)0x0;
    local_48.endLoc = (SourceLocation)0x0;
    pSVar6 = BumpAllocator::
             emplace<slang::ast::StatementList,std::span<slang::ast::Statement_const*,18446744073709551615ul>,slang::SourceRange>
                       (&this->super_BumpAllocator,&local_98,&local_48);
  }
  if (local_88[0].data_ != (pointer)local_88[0].firstElement) {
    operator_delete(local_88[0].data_);
  }
  return &pSVar6->super_Statement;
}

Assistant:

const Statement& Statement::bindItems(const SyntaxList<SyntaxNode>& items,
                                      const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Statement*> buffer;
    bindScopeInitializers(context, buffer);

    for (auto item : items) {
        if (StatementSyntax::isKind(item->kind)) {
            buffer.push_back(&bind(item->as<StatementSyntax>(), context, stmtCtx,
                                   /* inList */ true));
        }
    }

    if (buffer.size() == 1)
        return *buffer[0];

    auto& comp = context.getCompilation();
    return *comp.emplace<StatementList>(buffer.copy(comp), SourceRange());
}